

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int rows_eq(int *a,int *b)

{
  int i;
  int *b_local;
  int *a_local;
  
  i = 0;
  while( true ) {
    if (0xf < i) {
      return 1;
    }
    if (a[i] != b[i]) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

static int rows_eq(int *a, int *b)
{
  int i;

  for (i=0; i<16; i++)
    if (a[i] != b[i]) {
      return 0;
    }

  return 1;
}